

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZStream.h
# Opt level: O0

void __thiscall
TPZStream::Write<long,long>
          (TPZStream *this,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *vec)

{
  long index;
  bool bVar1;
  pointer ppVar2;
  int64_t in_RDI;
  const_iterator it;
  int64_t count;
  TPZManVector<long,_10> valVec;
  TPZManVector<long,_10> keyVec;
  int64_t sz;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
  *in_stack_fffffffffffffea8;
  TPZManVector<long,_10> *in_stack_fffffffffffffeb0;
  TPZVec<long> *in_stack_fffffffffffffeb8;
  TPZStream *in_stack_fffffffffffffec0;
  TPZManVector<long,_10> *in_stack_fffffffffffffed0;
  _Self local_128;
  _Base_ptr local_120;
  _Rb_tree_const_iterator<std::pair<const_long,_long>_> local_118;
  long local_110;
  TPZVec<long> local_f8 [3];
  TPZVec<long> local_88 [3];
  size_type local_18;
  
  local_18 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
             size((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *
                  )0x1aad431);
  TPZManVector<long,_10>::TPZManVector(in_stack_fffffffffffffed0,in_RDI);
  TPZManVector<long,_10>::TPZManVector(in_stack_fffffffffffffed0,in_RDI);
  local_110 = 0;
  std::_Rb_tree_const_iterator<std::pair<const_long,_long>_>::_Rb_tree_const_iterator(&local_118);
  local_120 = (_Base_ptr)
              std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
              begin(in_stack_fffffffffffffea8);
  local_118._M_node = local_120;
  while( true ) {
    local_128._M_node =
         (_Base_ptr)
         std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::end
                   (in_stack_fffffffffffffea8);
    bVar1 = std::operator!=(&local_118,&local_128);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_long,_long>_>::operator->
                       ((_Rb_tree_const_iterator<std::pair<const_long,_long>_> *)0x1aad4c5);
    in_stack_fffffffffffffeb8 = (TPZVec<long> *)ppVar2->first;
    in_stack_fffffffffffffec0 = (TPZStream *)TPZVec<long>::operator[](local_88,local_110);
    in_stack_fffffffffffffec0->_vptr_TPZStream = (_func_int **)in_stack_fffffffffffffeb8;
    ppVar2 = std::_Rb_tree_const_iterator<std::pair<const_long,_long>_>::operator->
                       ((_Rb_tree_const_iterator<std::pair<const_long,_long>_> *)0x1aad4fd);
    index = local_110;
    in_stack_fffffffffffffea8 =
         (map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)
         ppVar2->second;
    local_110 = local_110 + 1;
    in_stack_fffffffffffffeb0 = (TPZManVector<long,_10> *)TPZVec<long>::operator[](local_f8,index);
    (in_stack_fffffffffffffeb0->super_TPZVec<long>)._vptr_TPZVec =
         (_func_int **)in_stack_fffffffffffffea8;
    std::_Rb_tree_const_iterator<std::pair<const_long,_long>_>::operator++
              ((_Rb_tree_const_iterator<std::pair<const_long,_long>_> *)in_stack_fffffffffffffeb8,
               (int)((ulong)in_stack_fffffffffffffeb0 >> 0x20));
  }
  Write<long>(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  Write<long>(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  TPZManVector<long,_10>::~TPZManVector(in_stack_fffffffffffffeb0);
  TPZManVector<long,_10>::~TPZManVector(in_stack_fffffffffffffeb0);
  return;
}

Assistant:

void Write(const std::map<T, U> &vec) {
        int64_t sz = vec.size();
        TPZManVector<T> keyVec(sz);
        TPZManVector<U> valVec(sz);
        int64_t count = 0;
        typename std::map<T, U>::const_iterator it;
        for (it = vec.begin(); it != vec.end(); it++) {
            keyVec[count] = it->first;
            valVec[count++] = it->second;
        }
        Write(keyVec);
        Write(valVec);
    }